

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O1

CURLcode imap_done(connectdata *conn,CURLcode status,_Bool premature)

{
  Curl_easy *pCVar1;
  undefined4 *puVar2;
  imapstate iVar3;
  
  pCVar1 = conn->data;
  puVar2 = (undefined4 *)(pCVar1->req).protop;
  if (puVar2 == (undefined4 *)0x0) {
    return CURLE_OK;
  }
  if (status != CURLE_OK) {
    (conn->bits).close = true;
    goto LAB_0013c927;
  }
  status = CURLE_OK;
  if ((((pCVar1->set).connect_only != false) || (*(long *)(puVar2 + 0xe) != 0)) ||
     ((*(long *)(puVar2 + 6) == 0 && (status = CURLE_OK, (pCVar1->set).upload != true))))
  goto LAB_0013c927;
  iVar3 = IMAP_FETCH_FINAL;
  if ((pCVar1->set).upload == true) {
    status = Curl_pp_sendf(&(conn->proto).ftpc.pp,"%s","");
    if (status == CURLE_OK) {
      iVar3 = IMAP_APPEND_FINAL;
      goto LAB_0013c910;
    }
  }
  else {
LAB_0013c910:
    (conn->proto).imapc.state = iVar3;
    status = CURLE_OK;
  }
  if (status == CURLE_OK) {
    status = imap_block_statemach(conn);
  }
LAB_0013c927:
  (*Curl_cfree)(*(void **)(puVar2 + 2));
  *(undefined8 *)(puVar2 + 2) = 0;
  (*Curl_cfree)(*(void **)(puVar2 + 4));
  *(undefined8 *)(puVar2 + 4) = 0;
  (*Curl_cfree)(*(void **)(puVar2 + 6));
  *(undefined8 *)(puVar2 + 6) = 0;
  (*Curl_cfree)(*(void **)(puVar2 + 8));
  *(undefined8 *)(puVar2 + 8) = 0;
  (*Curl_cfree)(*(void **)(puVar2 + 10));
  *(undefined8 *)(puVar2 + 10) = 0;
  (*Curl_cfree)(*(void **)(puVar2 + 0xc));
  *(undefined8 *)(puVar2 + 0xc) = 0;
  (*Curl_cfree)(*(void **)(puVar2 + 0xe));
  *(undefined8 *)(puVar2 + 0xe) = 0;
  (*Curl_cfree)(*(void **)(puVar2 + 0x10));
  *(undefined8 *)(puVar2 + 0x10) = 0;
  *puVar2 = 0;
  return status;
}

Assistant:

static CURLcode imap_done(struct connectdata *conn, CURLcode status,
                          bool premature)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = conn->data;
  struct IMAP *imap = data->req.protop;

  (void)premature;

  if(!imap)
    return CURLE_OK;

  if(status) {
    connclose(conn, "IMAP done with bad status"); /* marked for closure */
    result = status;         /* use the already set error code */
  }
  else if(!data->set.connect_only && !imap->custom &&
          (imap->uid || data->set.upload)) {
    /* Handle responses after FETCH or APPEND transfer has finished */
    if(!data->set.upload)
      state(conn, IMAP_FETCH_FINAL);
    else {
      /* End the APPEND command first by sending an empty line */
      result = Curl_pp_sendf(&conn->proto.imapc.pp, "%s", "");
      if(!result)
        state(conn, IMAP_APPEND_FINAL);
    }

    /* Run the state-machine

       TODO: when the multi interface is used, this _really_ should be using
       the imap_multi_statemach function but we have no general support for
       non-blocking DONE operations!
    */
    if(!result)
      result = imap_block_statemach(conn);
  }

  /* Cleanup our per-request based variables */
  Curl_safefree(imap->mailbox);
  Curl_safefree(imap->uidvalidity);
  Curl_safefree(imap->uid);
  Curl_safefree(imap->section);
  Curl_safefree(imap->partial);
  Curl_safefree(imap->query);
  Curl_safefree(imap->custom);
  Curl_safefree(imap->custom_params);

  /* Clear the transfer mode for the next request */
  imap->transfer = FTPTRANSFER_BODY;

  return result;
}